

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSatOld.c
# Opt level: O0

void Cbs0_ManStop(Cbs0_Man_t *p)

{
  Cbs0_Man_t *p_local;
  
  Vec_IntFree(p->vModel);
  if ((p->pProp).pData != (Gia_Obj_t **)0x0) {
    free((p->pProp).pData);
    (p->pProp).pData = (Gia_Obj_t **)0x0;
  }
  if ((p->pJust).pData != (Gia_Obj_t **)0x0) {
    free((p->pJust).pData);
    (p->pJust).pData = (Gia_Obj_t **)0x0;
  }
  if (p != (Cbs0_Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Cbs0_ManStop( Cbs0_Man_t * p )
{
    Vec_IntFree( p->vModel );
    ABC_FREE( p->pProp.pData );
    ABC_FREE( p->pJust.pData );
    ABC_FREE( p );
}